

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiTableSettings * __thiscall
ImChunkStream<ImGuiTableSettings>::next_chunk
          (ImChunkStream<ImGuiTableSettings> *this,ImGuiTableSettings *p)

{
  int iVar1;
  ImGuiTableSettings *pIVar2;
  bool bVar3;
  size_t HDR_SZ;
  ImGuiTableSettings *p_local;
  ImChunkStream<ImGuiTableSettings> *this_local;
  
  pIVar2 = begin(this);
  bVar3 = false;
  if (pIVar2 <= p) {
    pIVar2 = end(this);
    bVar3 = p < pIVar2;
  }
  if (bVar3) {
    iVar1 = chunk_size(this,p);
    this_local = (ImChunkStream<ImGuiTableSettings> *)((long)&p->ID + (long)iVar1);
    pIVar2 = end(this);
    if (this_local == (ImChunkStream<ImGuiTableSettings> *)&pIVar2->SaveFlags) {
      this_local = (ImChunkStream<ImGuiTableSettings> *)0x0;
    }
    else {
      pIVar2 = end(this);
      if (pIVar2 <= this_local) {
        __assert_fail("p < end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_internal.h"
                      ,0x29f,
                      "T *ImChunkStream<ImGuiTableSettings>::next_chunk(T *) [T = ImGuiTableSettings]"
                     );
      }
    }
    return (ImGuiTableSettings *)this_local;
  }
  __assert_fail("p >= begin() && p < end()",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_internal.h"
                ,0x29f,
                "T *ImChunkStream<ImGuiTableSettings>::next_chunk(T *) [T = ImGuiTableSettings]");
}

Assistant:

T*      next_chunk(T* p)            { size_t HDR_SZ = 4; IM_ASSERT(p >= begin() && p < end()); p = (T*)(void*)((char*)(void*)p + chunk_size(p)); if (p == (T*)(void*)((char*)end() + HDR_SZ)) return (T*)0; IM_ASSERT(p < end()); return p; }